

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O3

void com_alf_lcu_row(com_core_t *core,int lcu_y)

{
  int *piVar1;
  int (*paiVar2) [9];
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  com_pic_t *pcVar9;
  com_seqh_t *pcVar10;
  s8 *psVar11;
  com_pic_header_t *pcVar12;
  u8 (*pauVar13) [3];
  u8 uVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  byte *pbVar23;
  pel *ppVar24;
  void *__src;
  ushort *puVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  pel *ppVar30;
  ushort *puVar31;
  byte *pbVar32;
  int iVar33;
  pel *local_a0;
  
  pcVar9 = core->pic;
  pcVar10 = core->seqhdr;
  uVar4 = pcVar10->max_cuwh;
  uVar26 = (ulong)(int)uVar4;
  iVar21 = uVar4 * lcu_y;
  iVar5 = pcVar9->stride_luma;
  iVar6 = pcVar9->stride_chroma;
  iVar15 = pcVar10->pic_width_in_lcu * lcu_y;
  uVar18 = pcVar10->pic_height - iVar21;
  if ((int)uVar4 < (int)uVar18) {
    uVar18 = uVar4;
  }
  uVar27 = (uint)(0 < lcu_y);
  uVar28 = uVar27;
  if (((0 < lcu_y) && (pcVar10->cross_patch_loop_filter == '\0')) &&
     (psVar11 = (core->map).map_patch, uVar28 = 0,
     psVar11[iVar15] == psVar11[(long)iVar15 - (long)pcVar10->pic_width_in_lcu])) {
    uVar28 = uVar27;
  }
  ppVar24 = pcVar9->uv;
  local_a0 = core->alf_src_buf[0];
  ppVar30 = core->alf_src_buf[1];
  iVar20 = uVar28 * 4 + -4;
  if (pcVar10->pic_height_in_lcu + -1 <= lcu_y) {
    iVar20 = uVar28 * 4;
  }
  pcVar12 = core->pichdr;
  pbVar23 = pcVar9->y + (int)((iVar21 + (uint)(uVar28 == 0) * 4 + -4) * iVar5);
  iVar7 = pcVar10->bit_depth_internal;
  iVar8 = pcVar10->pic_width;
  lVar22 = (long)iVar8;
  iVar3 = ((int)uVar18 >> 1) + iVar20;
  iVar29 = iVar20 + uVar18;
  pbVar32 = pbVar23;
  iVar19 = iVar29;
  if (iVar29 != 0 && SCARRY4(iVar20,uVar18) == iVar29 < 0) {
    do {
      *(uint *)(pbVar32 + -4) = (uint)*pbVar32 * 0x1010101;
      *(uint *)(pbVar32 + lVar22) = (uint)pbVar32[lVar22 + -1] * 0x1010101;
      iVar19 = iVar19 + -1;
      pbVar32 = pbVar32 + iVar5;
    } while (iVar19 != 0);
  }
  puVar31 = (ushort *)(ppVar24 + (int)(((iVar21 >> 1) + (uint)(uVar28 == 0) * 4 + -4) * iVar6));
  puVar25 = puVar31;
  iVar21 = iVar3;
  if (0 < iVar3) {
    do {
      *(ulong *)(puVar25 + -4) = (ulong)*puVar25 * 0x1000100010001;
      *(ulong *)((long)puVar25 + lVar22) =
           (ulong)*(ushort *)((long)puVar25 + lVar22 + -2) * 0x1000100010001;
      iVar21 = iVar21 + -1;
      puVar25 = (ushort *)((long)puVar25 + (long)iVar6);
    } while (iVar21 != 0);
  }
  if (0 < iVar8) {
    iVar20 = (((uint)(uVar26 >> 0x1f) & 1) + uVar4 & 0xfffffffe) + 0x40;
    local_a0 = local_a0 + 0x20;
    ppVar30 = ppVar30 + 0x20;
    lVar22 = (long)iVar15;
    piVar1 = (pcVar12->alf_param).filterCoeff_chroma;
    piVar17 = (pcVar12->alf_param).filterCoeff_chroma + 1;
    iVar15 = 3;
    iVar21 = 6;
    iVar19 = 0;
    do {
      uVar18 = iVar8 - iVar19;
      if ((int)uVar4 < iVar8 - iVar19) {
        uVar18 = uVar4;
      }
      pauVar13 = core->alf_enable_map;
      iVar16 = 3;
      if (pauVar13[lVar22][0] != '\0') {
        iVar16 = (pcVar12->alf_param).varIndTab[pcVar10->alf_idx_map[lVar22]];
        if (0 < iVar29) {
          pbVar32 = pbVar23 + -iVar15;
          ppVar24 = local_a0 + -iVar15;
          iVar33 = iVar29;
          do {
            memcpy(ppVar24,pbVar32,(long)(int)(iVar15 + uVar18 + 3));
            ppVar24 = ppVar24 + uVar26 + 0x20;
            pbVar32 = pbVar32 + iVar5;
            iVar33 = iVar33 + -1;
          } while (iVar33 != 0);
        }
        paiVar2 = (pcVar12->alf_param).filterCoeff_luma + iVar16;
        iVar15 = (int)(uVar26 + 0x20);
        (*uavs3d_funs_handle.alf[0])(pbVar23,iVar5,local_a0,iVar15,uVar18,iVar29,*paiVar2,iVar7);
        (*uavs3d_funs_handle.alf_fix[0])(pbVar23,iVar5,local_a0,iVar15,uVar18,iVar29,*paiVar2,iVar7)
        ;
        iVar16 = -3;
      }
      iVar15 = iVar16;
      iVar16 = (int)uVar18 >> 1;
      uVar14 = pauVar13[lVar22][1];
      if ((uVar14 == '\0') && (pauVar13[lVar22][2] == '\0')) {
        iVar21 = 6;
LAB_0011065a:
        if (pauVar13[lVar22][2] != '\0') {
          (*uavs3d_funs_handle.alf[2])
                    ((pel *)((long)puVar31 + 1),iVar6,ppVar30 + 1,iVar20,iVar16,iVar3,piVar17,iVar7)
          ;
          (*uavs3d_funs_handle.alf_fix[1])
                    ((pel *)((long)puVar31 + 1),iVar6,ppVar30 + 1,iVar20,iVar16,iVar3,piVar17,iVar7)
          ;
        }
      }
      else {
        if (0 < iVar3) {
          __src = (void *)((long)puVar31 + (long)-iVar21);
          ppVar24 = ppVar30 + -iVar21;
          iVar33 = iVar3;
          do {
            memcpy(ppVar24,__src,(long)(int)(iVar21 + (uVar18 & 0xfffffffe) + 6));
            ppVar24 = ppVar24 + iVar20;
            __src = (void *)((long)__src + (long)iVar6);
            iVar33 = iVar33 + -1;
          } while (iVar33 != 0);
          uVar14 = pauVar13[lVar22][1];
        }
        iVar21 = -6;
        if (uVar14 == '\0') goto LAB_0011065a;
        if (pauVar13[lVar22][2] == '\0') {
          (*uavs3d_funs_handle.alf[2])
                    ((pel *)puVar31,iVar6,ppVar30,iVar20,iVar16,iVar3,piVar1,iVar7);
          (*uavs3d_funs_handle.alf_fix[1])
                    ((pel *)puVar31,iVar6,ppVar30,iVar20,iVar16,iVar3,piVar1,iVar7);
          goto LAB_0011065a;
        }
        (*uavs3d_funs_handle.alf[1])((pel *)puVar31,iVar6,ppVar30,iVar20,iVar16,iVar3,piVar1,iVar7);
        (*uavs3d_funs_handle.alf_fix[1])
                  ((pel *)puVar31,iVar6,ppVar30,iVar20,iVar16,iVar3,piVar1,iVar7);
        (*uavs3d_funs_handle.alf_fix[1])
                  ((pel *)((long)puVar31 + 1),iVar6,ppVar30 + 1,iVar20,iVar16,iVar3,piVar17,iVar7);
        iVar21 = -6;
      }
      iVar19 = iVar19 + uVar4;
      lVar22 = lVar22 + 1;
      pbVar23 = pbVar23 + uVar26;
      puVar31 = (ushort *)((long)puVar31 + uVar26);
      local_a0 = local_a0 + uVar26;
      ppVar30 = ppVar30 + uVar26;
    } while (iVar19 < iVar8);
  }
  return;
}

Assistant:

void com_alf_lcu_row(com_core_t *core, int lcu_y)
{
    com_pic_t* pic = core->pic;
    com_seqh_t *seqhdr = core->seqhdr;
    com_map_t *map = &core->map;
    com_alf_pic_param_t *alfParam = &core->pichdr->alf_param;
    int lcu_size = seqhdr->max_cuwh;
    int pix_x, pix_y = lcu_y * lcu_size;
    int bit_depth = seqhdr->bit_depth_internal;
    int img_width = seqhdr->pic_width;
    int img_height = seqhdr->pic_height;
    int i_dstl = pic->stride_luma;
    int i_dstc = pic->stride_chroma;
    pel *dstl  = pic->y;
    pel *dstc  = pic->uv;
    int lcu_idx = lcu_y * seqhdr->pic_width_in_lcu;
    int lcu_h = COM_MIN(lcu_size, img_height - pix_y);
    int lcu_h_c = lcu_h >> 1;
    int isAboveAvail = (lcu_y > 0);
    int isBelowAvail = (lcu_y < seqhdr->pic_height_in_lcu - 1);
    int y_offset = 0, height_offset = 0;
    int pix_y_c = pix_y >> 1;
    int i_bufl = lcu_size + ALIGN_BASIC;
    int i_bufc = (lcu_size / 2 + ALIGN_BASIC) * 2;
    pel *bufl = core->alf_src_buf[0] + ALIGN_BASIC;
    pel *bufc = core->alf_src_buf[1] + ALIGN_BASIC;
    int adj_l = 3, adj_c = 6;

    if (!seqhdr->cross_patch_loop_filter && isAboveAvail) {
        s8* map_patch = map->map_patch + lcu_y * seqhdr->pic_width_in_lcu;
        if (isAboveAvail && map_patch[0] != map_patch[-seqhdr->pic_width_in_lcu]) {
            isAboveAvail = FALSE;
        }
    }
    if (isAboveAvail) {
        y_offset -= 4;
        height_offset += 4;
    }
    if (isBelowAvail) {
        height_offset -= 4;
    }
    dstl += (pix_y + y_offset) * i_dstl;
    dstc += (pix_y_c + y_offset) * i_dstc;
    
    lcu_h   += height_offset;
    lcu_h_c += height_offset;

    // padding
    pel *tmpl = dstl, *tmpr = dstl + img_width - 1;
    for (int i = 0; i < lcu_h; i++) {
#if (BIT_DEPTH == 8)
        M32(tmpl - 4) = tmpl[0] * 0x01010101;
        M32(tmpr + 1) = tmpr[0] * 0x01010101;
#else
        M64(tmpl - 4) = tmpl[0] * 0x0001000100010001;
        M64(tmpr + 1) = tmpr[0] * 0x0001000100010001;
#endif
        tmpl += i_dstl;
        tmpr += i_dstl;
    }

    tmpl = dstc, tmpr = dstc + img_width - 2;
    for (int i = 0; i < lcu_h_c; i++) {
#if (BIT_DEPTH == 8)
        M64(tmpl - 8) = M16(tmpl) * 0x0001000100010001;
        M64(tmpr + 2) = M16(tmpr) * 0x0001000100010001;
#else
        M64(tmpl - 8) = M64(tmpl - 4) = M32(tmpl) * 0x0000000100000001;
        M64(tmpr + 2) = M64(tmpr + 6) = M32(tmpr) * 0x0000000100000001;
#endif
        tmpl += i_dstc;
        tmpr += i_dstc;
    }

    for (pix_x = 0; pix_x < img_width; pix_x += lcu_size, lcu_idx++, dstl += lcu_size, dstc += lcu_size, bufl += lcu_size, bufc += lcu_size) {
        int lcu_w = COM_MIN(lcu_size, img_width  - pix_x);
        int lcu_w_c = lcu_w >> 1;
        u8 *enable_flag = core->alf_enable_map[lcu_idx];

        if (enable_flag[Y_C]) {
            int *coef = alfParam->filterCoeff_luma[alfParam->varIndTab[seqhdr->alf_idx_map[lcu_idx]]];
            pel *tmp_d = bufl - adj_l;
            pel *tmp_s = dstl - adj_l;
            int cpy_size = (lcu_w + 3 + adj_l) * sizeof(pel);
 
            for (int i = 0; i < lcu_h; i++) {
                memcpy(tmp_d, tmp_s, cpy_size);
                tmp_d += i_bufl;
                tmp_s += i_dstl;
            }
            uavs3d_funs_handle.alf    [Y_C](dstl, i_dstl, bufl, i_bufl, lcu_w, lcu_h, coef, bit_depth);
            uavs3d_funs_handle.alf_fix[Y_C](dstl, i_dstl, bufl, i_bufl, lcu_w, lcu_h, coef, bit_depth);
            adj_l = -3;
        } else {
            adj_l = 3;
        }
        if (enable_flag[U_C] || enable_flag[V_C]) {
            pel *tmp_d = bufc - adj_c;
            pel *tmp_s = dstc - adj_c;
            int cpy_size = (lcu_w_c * 2 + 6 + adj_c) * sizeof(pel);

            for (int i = 0; i < lcu_h_c; i++) {
                memcpy(tmp_d, tmp_s, cpy_size);
                tmp_d += i_bufc;
                tmp_s += i_dstc;
            }
            adj_c = -6;
        } else {
            adj_c = 6;
        }
        if (enable_flag[U_C] && enable_flag[V_C]) {
            uavs3d_funs_handle.alf    [UV_C](dstc,     i_dstc, bufc,     i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma    , bit_depth);
            uavs3d_funs_handle.alf_fix[UV_C](dstc,     i_dstc, bufc,     i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma    , bit_depth);
            uavs3d_funs_handle.alf_fix[UV_C](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
        } else {
            if (enable_flag[U_C]) {
                uavs3d_funs_handle.alf    [ 2  ](dstc, i_dstc, bufc, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma, bit_depth);
                uavs3d_funs_handle.alf_fix[UV_C](dstc, i_dstc, bufc, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma, bit_depth);
            }
            if (enable_flag[V_C]) {
                uavs3d_funs_handle.alf    [ 2  ](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
                uavs3d_funs_handle.alf_fix[UV_C](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
            }
        }
    }
}